

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ArrayJoinPromiseNodeBase::tracePromise
          (ArrayJoinPromiseNodeBase *this,TraceBuilder *builder,bool stopAtNextEvent)

{
  bool bVar1;
  Branch *pBVar2;
  PromiseNode *pPVar3;
  bool stopAtNextEvent_local;
  TraceBuilder *builder_local;
  ArrayJoinPromiseNodeBase *this_local;
  
  if ((!stopAtNextEvent) &&
     (bVar1 = Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::operator==
                        (&this->branches,(void *)0x0), ((bVar1 ^ 0xffU) & 1) != 0)) {
    pBVar2 = Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::operator[](&this->branches,0);
    pPVar3 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&pBVar2->dependency);
    (*(pPVar3->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar3,builder,0);
  }
  return;
}

Assistant:

void ArrayJoinPromiseNodeBase::tracePromise(TraceBuilder& builder, bool stopAtNextEvent) {
  // TODO(debug): Maybe use __builtin_return_address to get the locations that called
  //   joinPromises()?

  if (stopAtNextEvent) return;

  // Trace the first branch I guess.
  if (branches != nullptr) {
    branches[0].dependency->tracePromise(builder, false);
  }
}